

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Gemm_x86::forward
          (Gemm_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  const_reference pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  float *pfVar6;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  Option *in_stack_00000048;
  int in_stack_00000210;
  int in_stack_00000218;
  int in_stack_00000220;
  int in_stack_00000228;
  int in_stack_00000230;
  int in_stack_00000238;
  int i_1;
  int size_1;
  Mat *B_3;
  Mat *A_3;
  Mat *A_2;
  Mat *B_2;
  int ret;
  int _nT;
  Mat *top_blob;
  size_t out_elemsize;
  int outh;
  int out_elempack;
  int i;
  int size;
  Mat C2;
  int in_stack_00000310;
  int in_stack_00000318;
  int in_stack_00000320;
  int in_stack_00000328;
  int in_stack_00000330;
  int in_stack_00000338;
  Option *in_stack_00000340;
  int broadcast_type_C;
  Mat C;
  Mat *B_1;
  Mat *A_1;
  Mat *A;
  Mat *B;
  int N;
  int M;
  undefined4 in_stack_fffffffffffff760;
  int in_stack_fffffffffffff764;
  undefined4 in_stack_fffffffffffff768;
  int in_stack_fffffffffffff76c;
  undefined4 in_stack_fffffffffffff770;
  int in_stack_fffffffffffff774;
  undefined8 in_stack_fffffffffffff778;
  int _w;
  Mat *in_stack_fffffffffffff780;
  Allocator *in_stack_fffffffffffff7e0;
  bool local_7fd;
  int local_7fc;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  int local_688;
  int local_684;
  int local_678;
  int local_64c;
  int local_62c;
  int local_628;
  Mat local_620;
  Mat *local_5d8;
  Mat *local_5d0;
  Mat *local_5c8;
  int local_5c0;
  Mat *local_5b8;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  size_t local_598;
  Mat local_590;
  Mat *local_548;
  Mat *local_540;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  Mat *pMVar7;
  size_t sVar8;
  int iVar9;
  Mat *in_stack_fffffffffffffad0;
  Mat *in_stack_fffffffffffffad8;
  Mat *in_stack_fffffffffffffae0;
  Mat *in_stack_fffffffffffffae8;
  int local_510;
  size_t local_508;
  Mat *local_500;
  Mat *local_4f8;
  Mat *local_4f0;
  int local_4e8;
  Mat *local_4e0;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  size_t local_4c0;
  int in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 uVar10;
  Mat *C_00;
  Mat *BT;
  Mat *A_00;
  int local_488;
  Mat *local_480;
  int local_478;
  int local_474;
  int local_470;
  int local_468;
  size_t local_460;
  int local_438;
  int local_434;
  int local_40c;
  Mat **in_stack_fffffffffffffc28;
  Mat *in_stack_fffffffffffffc30;
  Mat *in_stack_fffffffffffffc38;
  Mat *in_stack_fffffffffffffc40;
  Mat *in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  int in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  Mat *in_stack_fffffffffffffcd0;
  Mat *in_stack_fffffffffffffcd8;
  Mat *in_stack_fffffffffffffce0;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  Mat *in_stack_ffffffffffffff58;
  
  sVar8 = CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8);
  if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0)) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0) {
        pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
        pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
          if (pvVar4->dims == 3) {
            local_698 = pvVar4->c;
          }
          else {
            local_698 = pvVar4->h;
          }
          local_694 = local_698 * pvVar4->elempack;
        }
        else {
          local_694 = pvVar4->w;
        }
        local_434 = local_694;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0) {
          local_6a0 = pvVar2->w;
        }
        else {
          if (pvVar2->dims == 3) {
            local_69c = pvVar2->c;
          }
          else {
            local_69c = pvVar2->h;
          }
          local_6a0 = local_69c * pvVar2->elempack;
        }
        local_438 = local_6a0;
      }
      else {
        pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
          if (pvVar4->dims == 3) {
            local_690 = pvVar4->c;
          }
          else {
            local_690 = pvVar4->h;
          }
          local_68c = local_690 * pvVar4->elempack;
        }
        else {
          local_68c = pvVar4->w;
        }
        local_434 = local_68c;
        local_438 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
      }
    }
    else {
      pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
      local_434 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0) {
        local_688 = pvVar4->w;
      }
      else {
        if (pvVar4->dims == 3) {
          local_684 = pvVar4->c;
        }
        else {
          local_684 = pvVar4->h;
        }
        local_688 = local_684 * pvVar4->elempack;
      }
      local_438 = local_688;
    }
  }
  else {
    local_434 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
    local_438 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
  }
  C_00 = (Mat *)0x0;
  BT = (Mat *)0x0;
  A_00 = (Mat *)0x0;
  local_488 = 0;
  local_480 = (Mat *)0x0;
  local_478 = 0;
  local_474 = 0;
  local_470 = 0;
  local_468 = 0;
  local_460 = 0;
  uVar10 = 0;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 0) {
    if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) ||
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0)) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0) {
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
          if (sVar3 == 3) {
            pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,2);
            local_5d8 = (Mat *)pvVar4->data;
            local_5d0 = (Mat *)pvVar4->refcount;
            local_5c8 = (Mat *)pvVar4->elemsize;
            local_5c0 = pvVar4->elempack;
            local_5b8 = (Mat *)pvVar4->allocator;
            local_5b0 = pvVar4->dims;
            local_5ac = pvVar4->w;
            local_5a8 = pvVar4->h;
            local_5a4 = pvVar4->d;
            local_5a0 = pvVar4->c;
            local_598 = pvVar4->cstep;
            if (local_5d0 != (Mat *)0x0) {
              LOCK();
              *(int *)&local_5d0->data = *(int *)&local_5d0->data + 1;
              UNLOCK();
            }
          }
          else {
            local_5d8 = (Mat *)0x0;
            local_5d0 = (Mat *)0x0;
            local_5c8 = (Mat *)0x0;
            local_5c0 = 0;
            local_5b8 = (Mat *)0x0;
            local_5b0 = 0;
            local_5ac = 0;
            local_5a8 = 0;
            local_5a4 = 0;
            local_5a0 = 0;
            local_598 = 0;
          }
          if ((Mat **)&stack0xfffffffffffffb60 != &local_5d8) {
            if (local_5d0 != (Mat *)0x0) {
              LOCK();
              *(int *)&local_5d0->data = *(int *)&local_5d0->data + 1;
              UNLOCK();
            }
            if (BT != (Mat *)0x0) {
              LOCK();
              iVar9 = *(int *)&BT->data;
              *(int *)&BT->data = *(int *)&BT->data + -1;
              UNLOCK();
              if (iVar9 == 1) {
                if (C_00 != (Mat *)0x0) {
                  free(C_00);
                }
                in_stack_ffffffffffffff28 = (int)C_00;
              }
            }
            local_488 = local_5c0;
            local_480 = local_5b8;
            local_478 = local_5b0;
            local_474 = local_5ac;
            local_470 = local_5a8;
            local_468 = local_5a0;
            local_460 = local_598;
            C_00 = local_5d8;
            BT = local_5d0;
            A_00 = local_5c8;
          }
          if (local_5d0 != (Mat *)0x0) {
            LOCK();
            iVar9 = *(int *)&local_5d0->data;
            *(int *)&local_5d0->data = *(int *)&local_5d0->data + -1;
            UNLOCK();
            if (iVar9 == 1) {
              if (local_5b8 == (Mat *)0x0) {
                if (local_5d8 != (Mat *)0x0) {
                  free(local_5d8);
                }
              }
              else {
                (**(_func_int **)((long)local_5b8->data + 0x18))(local_5b8,local_5d8);
              }
            }
          }
          local_5d8 = (Mat *)0x0;
          local_5c8 = (Mat *)0x0;
          local_5c0 = 0;
          local_5b0 = 0;
          local_5ac = 0;
          local_5a8 = 0;
          local_5a4 = 0;
          local_5a0 = 0;
          local_598 = 0;
          local_5d0 = (Mat *)0x0;
        }
        else {
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
          if (sVar3 == 2) {
            pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
            local_590.data = pvVar4->data;
            local_590.refcount = pvVar4->refcount;
            local_590.elemsize = pvVar4->elemsize;
            local_590.elempack = pvVar4->elempack;
            local_590.allocator = pvVar4->allocator;
            local_590.dims = pvVar4->dims;
            local_590.w = pvVar4->w;
            local_590.h = pvVar4->h;
            local_590.d = pvVar4->d;
            local_590.c = pvVar4->c;
            local_590.cstep = pvVar4->cstep;
            if ((Mat *)local_590.refcount != (Mat *)0x0) {
              LOCK();
              *(int *)&((Mat *)local_590.refcount)->data =
                   *(int *)&((Mat *)local_590.refcount)->data + 1;
              UNLOCK();
            }
          }
          else {
            local_590.data = (Mat *)0x0;
            local_590.refcount = (int *)0x0;
            local_590.elemsize = 0;
            local_590.elempack = 0;
            local_590.allocator = (Allocator *)0x0;
            local_590.dims = 0;
            local_590.w = 0;
            local_590.h = 0;
            local_590.d = 0;
            local_590.c = 0;
            local_590.cstep = 0;
          }
          if ((Mat *)&stack0xfffffffffffffb60 != &local_590) {
            if ((Mat *)local_590.refcount != (Mat *)0x0) {
              LOCK();
              *(int *)(void **)local_590.refcount = *(int *)(void **)local_590.refcount + 1;
              UNLOCK();
            }
            if (BT != (Mat *)0x0) {
              LOCK();
              iVar9 = *(int *)&BT->data;
              *(int *)&BT->data = *(int *)&BT->data + -1;
              UNLOCK();
              if (iVar9 == 1) {
                if (C_00 != (Mat *)0x0) {
                  free(C_00);
                }
                in_stack_ffffffffffffff20 = (int)C_00;
              }
            }
            local_488 = local_590.elempack;
            local_480 = (Mat *)local_590.allocator;
            local_478 = local_590.dims;
            local_474 = local_590.w;
            local_470 = local_590.h;
            local_468 = local_590.c;
            local_460 = local_590.cstep;
            C_00 = (Mat *)local_590.data;
            BT = (Mat *)local_590.refcount;
            A_00 = (Mat *)local_590.elemsize;
          }
          in_stack_fffffffffffffc48 = &local_590;
          if ((Mat *)local_590.refcount != (Mat *)0x0) {
            LOCK();
            iVar9 = *(int *)(void **)local_590.refcount;
            *(int *)(void **)local_590.refcount = *(int *)(void **)local_590.refcount + -1;
            UNLOCK();
            if (iVar9 == 1) {
              if ((Mat *)local_590.allocator == (Mat *)0x0) {
                in_stack_ffffffffffffff58 = (Mat *)local_590.data;
                if ((Mat *)local_590.data != (Mat *)0x0) {
                  free(local_590.data);
                  in_stack_ffffffffffffff58 = (Mat *)local_590.data;
                }
              }
              else {
                (*(local_590.allocator)->_vptr_Allocator[3])(local_590.allocator,local_590.data);
              }
            }
          }
          local_590.data = (void *)0x0;
          local_590.elemsize = 0;
          local_590.elempack = 0;
          local_590.dims = 0;
          local_590.w = 0;
          local_590.h = 0;
          local_590.d = 0;
          local_590.c = 0;
          local_590.cstep = 0;
          local_590.refcount = (int *)0x0;
        }
      }
      else {
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
        if (sVar3 == 2) {
          pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
          local_548 = (Mat *)pvVar4->data;
          local_540 = (Mat *)pvVar4->refcount;
          pMVar7 = (Mat *)pvVar4->elemsize;
          iVar9 = pvVar4->elempack;
          in_stack_fffffffffffffad8 = (Mat *)pvVar4->allocator;
          iVar9 = pvVar4->dims;
          iVar9 = pvVar4->w;
          iVar9 = pvVar4->h;
          iVar9 = pvVar4->d;
          local_510 = pvVar4->c;
          local_508 = pvVar4->cstep;
          if (local_540 != (Mat *)0x0) {
            LOCK();
            *(int *)&local_540->data = *(int *)&local_540->data + 1;
            UNLOCK();
          }
        }
        else {
          local_548 = (Mat *)0x0;
          local_540 = (Mat *)0x0;
          pMVar7 = (Mat *)0x0;
          iVar9 = 0;
          in_stack_fffffffffffffad8 = (Mat *)0x0;
          iVar9 = 0;
          iVar9 = 0;
          iVar9 = 0;
          iVar9 = 0;
          local_510 = 0;
          local_508 = 0;
        }
        if ((Mat **)&stack0xfffffffffffffb60 != &local_548) {
          if (local_540 != (Mat *)0x0) {
            LOCK();
            *(int *)&local_540->data = *(int *)&local_540->data + 1;
            UNLOCK();
          }
          A_00 = pMVar7;
          if (BT != (Mat *)0x0) {
            LOCK();
            iVar9 = *(int *)&BT->data;
            *(int *)&BT->data = *(int *)&BT->data + -1;
            UNLOCK();
            if ((iVar9 == 1) && (C_00 != (Mat *)0x0)) {
              free(C_00);
              A_00 = pMVar7;
            }
          }
          local_488 = (int)in_stack_fffffffffffffad0;
          local_478 = (int)in_stack_fffffffffffffae0;
          local_474 = (int)((ulong)in_stack_fffffffffffffae0 >> 0x20);
          local_470 = (int)in_stack_fffffffffffffae8;
          local_468 = local_510;
          local_460 = local_508;
          C_00 = local_548;
          BT = local_540;
          local_480 = in_stack_fffffffffffffad8;
        }
        in_stack_fffffffffffffc38 = (Mat *)&local_548;
        if (local_540 != (Mat *)0x0) {
          LOCK();
          iVar9 = *(int *)&local_540->data;
          *(int *)&local_540->data = *(int *)&local_540->data + -1;
          UNLOCK();
          if (iVar9 == 1) {
            if (in_stack_fffffffffffffad8 == (Mat *)0x0) {
              if (local_548 != (Mat *)0x0) {
                free(local_548);
              }
              in_stack_ffffffffffffff48 = (int)local_548;
            }
            else {
              (**(_func_int **)((long)in_stack_fffffffffffffad8->data + 0x18))
                        (in_stack_fffffffffffffad8,local_548);
            }
          }
        }
        local_548 = (Mat *)0x0;
        sVar8 = 0;
        iVar9 = 0;
        iVar9 = 0;
        iVar9 = 0;
        local_540 = (Mat *)0x0;
      }
    }
    else {
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
      if (sVar3 == 1) {
        pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
        local_500 = (Mat *)pvVar4->data;
        local_4f8 = (Mat *)pvVar4->refcount;
        local_4f0 = (Mat *)pvVar4->elemsize;
        local_4e8 = pvVar4->elempack;
        local_4e0 = (Mat *)pvVar4->allocator;
        local_4d8 = pvVar4->dims;
        local_4d4 = pvVar4->w;
        local_4d0 = pvVar4->h;
        local_4cc = pvVar4->d;
        local_4c8 = pvVar4->c;
        local_4c0 = pvVar4->cstep;
        if (local_4f8 != (Mat *)0x0) {
          LOCK();
          *(int *)&local_4f8->data = *(int *)&local_4f8->data + 1;
          UNLOCK();
        }
      }
      else {
        local_500 = (Mat *)0x0;
        local_4f8 = (Mat *)0x0;
        local_4f0 = (Mat *)0x0;
        local_4e8 = 0;
        local_4e0 = (Mat *)0x0;
        local_4d8 = 0;
        local_4d4 = 0;
        local_4d0 = 0;
        local_4cc = 0;
        local_4c8 = 0;
        local_4c0 = 0;
      }
      if ((Mat **)&stack0xfffffffffffffb60 != &local_500) {
        if (local_4f8 != (Mat *)0x0) {
          LOCK();
          *(int *)&local_4f8->data = *(int *)&local_4f8->data + 1;
          UNLOCK();
        }
        if (BT != (Mat *)0x0) {
          LOCK();
          iVar9 = *(int *)&BT->data;
          *(int *)&BT->data = *(int *)&BT->data + -1;
          UNLOCK();
          if ((iVar9 == 1) && (C_00 != (Mat *)0x0)) {
            free(C_00);
          }
        }
        local_488 = local_4e8;
        local_480 = local_4e0;
        local_478 = local_4d8;
        local_474 = local_4d4;
        local_470 = local_4d0;
        local_468 = local_4c8;
        local_460 = local_4c0;
        C_00 = local_500;
        BT = local_4f8;
        A_00 = local_4f0;
      }
      in_stack_fffffffffffffc28 = &local_500;
      if (local_4f8 != (Mat *)0x0) {
        LOCK();
        iVar9 = *(int *)&local_4f8->data;
        *(int *)&local_4f8->data = *(int *)&local_4f8->data + -1;
        UNLOCK();
        if (iVar9 == 1) {
          if (local_4e0 == (Mat *)0x0) {
            if (local_500 != (Mat *)0x0) {
              free(local_500);
            }
            in_stack_ffffffffffffff38 = (int)local_500;
          }
          else {
            (**(_func_int **)((long)local_4e0->data + 0x18))(local_4e0,local_500);
          }
        }
      }
      local_500 = (Mat *)0x0;
      local_4f0 = (Mat *)0x0;
      local_4e8 = 0;
      local_4d8 = 0;
      local_4d4 = 0;
      local_4d0 = 0;
      local_4cc = 0;
      local_4c8 = 0;
      local_4c0 = 0;
      local_4f8 = (Mat *)0x0;
    }
    if (C_00 != (Mat *)0x0 && local_460 * (long)local_468 != 0) {
      if ((local_478 == 1) && (local_474 == 1)) {
        uVar10 = 0;
      }
      if ((local_478 == 1) && (local_474 * local_488 == local_434)) {
        uVar10 = 1;
      }
      if ((local_478 == 1) && (local_474 * local_488 == local_438)) {
        uVar10 = 4;
      }
      if (((local_478 == 2) && (local_474 == 1)) && (local_470 * local_488 == local_434)) {
        uVar10 = 2;
      }
      if (((local_478 == 2) && (local_474 == local_438)) && (local_470 * local_488 == local_434)) {
        uVar10 = 3;
      }
      if (((local_478 == 2) && (local_474 == local_438)) && (local_470 * local_488 == 1)) {
        uVar10 = 4;
      }
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      if ((fVar1 != 1.0) || (NAN(fVar1))) {
        local_620.data = (Mat *)0x0;
        local_620.refcount = (int *)0x0;
        local_620.elemsize = 0;
        local_620.elempack = 0;
        local_620.allocator = (Allocator *)0x0;
        local_620.dims = 0;
        local_620.w = 0;
        local_620.h = 0;
        local_620.d = 0;
        local_620.c = 0;
        local_620.cstep = 0;
        Mat::create_like((Mat *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                         (Mat *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                         (Allocator *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760))
        ;
        for (local_628 = 0; local_628 < (int)local_460 * local_468 * local_488;
            local_628 = local_628 + 1) {
          *(float *)((long)(void **)local_620.data + (long)local_628 * 4) =
               *(float *)((long)&C_00->data + (long)local_628 * 4) *
               *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        }
        if ((Mat *)&stack0xfffffffffffffb60 != &local_620) {
          if ((Mat *)local_620.refcount != (Mat *)0x0) {
            LOCK();
            *(int *)(void **)local_620.refcount = *(int *)(void **)local_620.refcount + 1;
            UNLOCK();
          }
          if (BT != (Mat *)0x0) {
            LOCK();
            iVar9 = *(int *)&BT->data;
            *(int *)&BT->data = *(int *)&BT->data + -1;
            UNLOCK();
            if (iVar9 == 1) {
              if (local_480 == (Mat *)0x0) {
                if (C_00 != (Mat *)0x0) {
                  free(C_00);
                }
                in_stack_ffffffffffffff30 = (int)C_00;
              }
              else {
                (**(_func_int **)((long)local_480->data + 0x18))(local_480,C_00);
              }
            }
          }
          local_480 = (Mat *)local_620.allocator;
          C_00 = (Mat *)local_620.data;
          BT = (Mat *)local_620.refcount;
          A_00 = (Mat *)local_620.elemsize;
        }
        in_stack_fffffffffffffcd0 = &local_620;
        if ((Mat *)local_620.refcount != (Mat *)0x0) {
          in_stack_fffffffffffffccc = 0xffffffff;
          LOCK();
          in_stack_fffffffffffffcc8 = *(int *)(void **)local_620.refcount;
          *(int *)(void **)local_620.refcount = *(int *)(void **)local_620.refcount + -1;
          UNLOCK();
          if (in_stack_fffffffffffffcc8 == 1) {
            if ((Mat *)local_620.allocator == (Mat *)0x0) {
              if ((Mat *)local_620.data != (Mat *)0x0) {
                free(local_620.data);
              }
            }
            else {
              (*(local_620.allocator)->_vptr_Allocator[3])(local_620.allocator,local_620.data);
            }
          }
        }
        local_620.data = (void *)0x0;
        local_620.elemsize = 0;
        local_620.elempack = 0;
        local_620.dims = 0;
        local_620.w = 0;
        local_620.h = 0;
        local_620.d = 0;
        local_620.c = 0;
        local_620.cstep = 0;
        local_620.refcount = (int *)0x0;
      }
    }
  }
  else {
    if ((long *)&stack0xfffffffffffffb60 != in_RDI + 0x14) {
      if (in_RDI[0x15] != 0) {
        LOCK();
        *(int *)in_RDI[0x15] = *(int *)in_RDI[0x15] + 1;
        UNLOCK();
      }
      C_00 = (Mat *)in_RDI[0x14];
      BT = (Mat *)in_RDI[0x15];
      A_00 = (Mat *)in_RDI[0x16];
      local_480 = (Mat *)in_RDI[0x18];
    }
    uVar10 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8);
  }
  local_62c = 1;
  if ((*(byte *)(in_RCX + 0x27) & 1) != 0) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) == 0) {
      local_7fc = local_434;
    }
    else {
      local_7fc = local_438;
    }
    local_62c = 1;
    if (local_7fc % 4 == 0) {
      local_62c = 4;
    }
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) != 0) {
    local_62c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100);
  }
  pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  iVar9 = (int)in_stack_fffffffffffff778;
  _w = (int)((ulong)in_stack_fffffffffffff778 >> 0x20);
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) == 0) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc) == 0) {
      Mat::create(in_stack_fffffffffffff780,_w,iVar9,
                  CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                  in_stack_fffffffffffff76c,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    }
    else {
      Mat::create(in_stack_fffffffffffff780,_w,iVar9,in_stack_fffffffffffff774,
                  CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                  in_stack_fffffffffffff764,in_stack_fffffffffffff7e0);
    }
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc) == 0) {
    Mat::create(in_stack_fffffffffffff780,_w,iVar9,
                CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                in_stack_fffffffffffff76c,
                (Allocator *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  }
  else {
    Mat::create(in_stack_fffffffffffff780,_w,iVar9,in_stack_fffffffffffff774,
                CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                in_stack_fffffffffffff764,in_stack_fffffffffffff7e0);
  }
  local_7fd = true;
  if (pvVar5->data != (void *)0x0) {
    local_7fd = pvVar5->cstep * (long)pvVar5->c == 0;
  }
  if (local_7fd) {
    local_40c = -100;
  }
  else {
    if (((int)in_RDI[1] != 0) && (*(int *)(in_RCX + 4) != (int)in_RDI[1])) {
      fprintf(_stderr,"opt.num_threads %d changed, gemm will use load-time value %d",
              (ulong)*(uint *)(in_RCX + 4),(ulong)*(uint *)(in_RDI + 1));
      fprintf(_stderr,"\n");
    }
    if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) ||
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0)) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0) {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
          local_64c = gemm_x86(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                               in_stack_fffffffffffffcd0,
                               (Mat *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                               in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0,in_stack_00000310
                               ,in_stack_00000318,in_stack_00000320,in_stack_00000328,
                               in_stack_00000330,in_stack_00000338,in_stack_00000340);
        }
        else {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
          local_64c = gemm_BT_x86(A_00,BT,C_00,(Mat *)CONCAT44(uVar10,in_stack_fffffffffffffb58),
                                  in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                                  in_stack_00000010,in_stack_00000018,in_stack_00000020,
                                  in_stack_00000028,in_stack_00000030,in_stack_00000038,
                                  in_stack_00000040,in_stack_00000048);
        }
      }
      else {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
        local_64c = gemm_AT_x86(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                                in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                                (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                                (int)in_stack_fffffffffffffc28,in_stack_00000210,in_stack_00000218,
                                in_stack_00000220,in_stack_00000228,in_stack_00000230,
                                in_stack_00000238,i_1,(Option *)B_3);
      }
    }
    else {
      local_64c = gemm_AT_BT_x86(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                                 in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                                 (int)(sVar8 >> 0x20),(int)sVar8,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                                 in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
                                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                                 (Option *)in_stack_ffffffffffffff58);
    }
    fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    if ((fVar1 != 1.0) || (NAN(fVar1))) {
      sVar8 = pvVar5->cstep;
      iVar9 = pvVar5->c;
      for (local_678 = 0; local_678 < (int)sVar8 * iVar9 * local_62c; local_678 = local_678 + 1) {
        pfVar6 = (float *)((long)pvVar5->data + (long)local_678 * 4);
        *pfVar6 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * *pfVar6;
      }
    }
    local_40c = local_64c;
  }
  if (BT != (Mat *)0x0) {
    LOCK();
    iVar9 = *(int *)&BT->data;
    *(int *)&BT->data = *(int *)&BT->data + -1;
    UNLOCK();
    if (iVar9 == 1) {
      if (local_480 == (Mat *)0x0) {
        if (C_00 != (Mat *)0x0) {
          free(C_00);
        }
      }
      else {
        (**(_func_int **)((long)local_480->data + 0x18))(local_480,C_00);
      }
    }
  }
  return local_40c;
}

Assistant:

int Gemm_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return ret;
}